

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O0

void Qentem::Test::TestTrimRight(QTest *test)

{
  uint local_f0 [56];
  QTest *pQStack_10;
  SizeT32 end_offset;
  QTest *test_local;
  
  local_f0[0x37] = 0;
  pQStack_10 = test;
  StringUtils::TrimRight<char,unsigned_int>("",0,local_f0 + 0x37);
  local_f0[0x36] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x36,0xf4);
  StringUtils::TrimRight<char,unsigned_int>("",1,local_f0 + 0x37);
  local_f0[0x35] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x35,0xf7);
  StringUtils::TrimRight<char,unsigned_int>("",10,local_f0 + 0x37);
  local_f0[0x34] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x34,0xfa);
  StringUtils::TrimRight<char,unsigned_int>("a",0,local_f0 + 0x37);
  local_f0[0x33] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x33,0xfd);
  StringUtils::TrimRight<char,unsigned_int>("abc",0,local_f0 + 0x37);
  local_f0[0x32] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x32,0x100);
  StringUtils::TrimRight<char,unsigned_int>("a ",1,local_f0 + 0x37);
  local_f0[0x31] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x31,0x103);
  StringUtils::TrimRight<char,unsigned_int>("abc ",4,local_f0 + 0x37);
  local_f0[0x30] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x30,0x106);
  StringUtils::TrimRight<char,unsigned_int>("a  ",3,local_f0 + 0x37);
  local_f0[0x2f] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x2f,0x109);
  StringUtils::TrimRight<char,unsigned_int>("abc  ",5,local_f0 + 0x37);
  local_f0[0x2e] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x2e,0x10c);
  StringUtils::TrimRight<char,unsigned_int>("a   ",4,local_f0 + 0x37);
  local_f0[0x2d] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x2d,0x10f);
  StringUtils::TrimRight<char,unsigned_int>("abc   ",6,local_f0 + 0x37);
  local_f0[0x2c] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x2c,0x112);
  local_f0[0x37] = 2;
  StringUtils::TrimRight<char,unsigned_int>("a ",0,local_f0 + 0x37);
  local_f0[0x2b] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x2b,0x116);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>("abc ",0,local_f0 + 0x37);
  local_f0[0x2a] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x2a,0x11a);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("a  ",0,local_f0 + 0x37);
  local_f0[0x29] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x29,0x11e);
  local_f0[0x37] = 5;
  StringUtils::TrimRight<char,unsigned_int>("abc  ",0,local_f0 + 0x37);
  local_f0[0x28] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x28,0x122);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>("a   ",4,local_f0 + 0x37);
  local_f0[0x27] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x27,0x126);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>("a   ",0,local_f0 + 0x37);
  local_f0[0x26] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x26,0x12a);
  local_f0[0x37] = 6;
  StringUtils::TrimRight<char,unsigned_int>("abc   ",6,local_f0 + 0x37);
  local_f0[0x25] = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x25,0x12e);
  local_f0[0x37] = 6;
  StringUtils::TrimRight<char,unsigned_int>("abc   ",3,local_f0 + 0x37);
  local_f0[0x24] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x24,0x132);
  local_f0[0x37] = 6;
  StringUtils::TrimRight<char,unsigned_int>("abc   ",2,local_f0 + 0x37);
  local_f0[0x23] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x23,0x136);
  local_f0[0x37] = 6;
  StringUtils::TrimRight<char,unsigned_int>("abc   ",0,local_f0 + 0x37);
  local_f0[0x22] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x22,0x13a);
  local_f0[0x37] = 2;
  StringUtils::TrimRight<char,unsigned_int>(" a",0,local_f0 + 0x37);
  local_f0[0x21] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x21,0x13e);
  local_f0[0x37] = 2;
  StringUtils::TrimRight<char,unsigned_int>(" a",1,local_f0 + 0x37);
  local_f0[0x20] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x20,0x142);
  local_f0[0x37] = 2;
  StringUtils::TrimRight<char,unsigned_int>(" a",2,local_f0 + 0x37);
  local_f0[0x1f] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x1f,0x146);
  local_f0[0x37] = 1;
  StringUtils::TrimRight<char,unsigned_int>(" a",0,local_f0 + 0x37);
  local_f0[0x1e] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x1e,0x14a);
  local_f0[0x37] = 1;
  StringUtils::TrimRight<char,unsigned_int>(" a",1,local_f0 + 0x37);
  local_f0[0x1d] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x1d,0x14e);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>(" abc",0,local_f0 + 0x37);
  local_f0[0x1c] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x1c,0x152);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("  a",0,local_f0 + 0x37);
  local_f0[0x1b] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x1b,0x156);
  local_f0[0x37] = 5;
  StringUtils::TrimRight<char,unsigned_int>("  abc",0,local_f0 + 0x37);
  local_f0[0x1a] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x1a,0x15a);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>("   a",0,local_f0 + 0x37);
  local_f0[0x19] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x19,0x15e);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("   a",0,local_f0 + 0x37);
  local_f0[0x18] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x18,0x162);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("   a",2,local_f0 + 0x37);
  local_f0[0x17] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x17,0x166);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("   a",1,local_f0 + 0x37);
  local_f0[0x16] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x16,0x16a);
  local_f0[0x37] = 6;
  StringUtils::TrimRight<char,unsigned_int>("   abc",0,local_f0 + 0x37);
  local_f0[0x15] = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x15,0x16e);
  local_f0[0x37] = 5;
  StringUtils::TrimRight<char,unsigned_int>("   abc",0,local_f0 + 0x37);
  local_f0[0x14] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x14,0x172);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>("   abc",0,local_f0 + 0x37);
  local_f0[0x13] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x13,0x176);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("   abc",0,local_f0 + 0x37);
  local_f0[0x12] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x12,0x17a);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("   abc",1,local_f0 + 0x37);
  local_f0[0x11] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x11,0x17e);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("   abc",2,local_f0 + 0x37);
  local_f0[0x10] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0x10,0x182);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>(" a ",0,local_f0 + 0x37);
  local_f0[0xf] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0xf,0x186);
  local_f0[0x37] = 5;
  StringUtils::TrimRight<char,unsigned_int>(" abc ",0,local_f0 + 0x37);
  local_f0[0xe] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0xe,0x18a);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>(" a  ",4,local_f0 + 0x37);
  local_f0[0xd] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0xd,0x18e);
  local_f0[0x37] = 5;
  StringUtils::TrimRight<char,unsigned_int>(" a\n\r\t",0,local_f0 + 0x37);
  local_f0[0xc] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0xc,0x192);
  local_f0[0x37] = 6;
  StringUtils::TrimRight<char,unsigned_int>(" abc  ",0,local_f0 + 0x37);
  local_f0[0xb] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 0xb,0x196);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>("  a   ",0,local_f0 + 0x37);
  local_f0[10] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 10,0x19a);
  local_f0[0x37] = 8;
  StringUtils::TrimRight<char,unsigned_int>("  abc   ",0,local_f0 + 0x37);
  local_f0[9] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 9,0x19e);
  local_f0[0x37] = 1;
  StringUtils::TrimRight<char,unsigned_int>(" ",1,local_f0 + 0x37);
  local_f0[8] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 8,0x1a2);
  local_f0[0x37] = 2;
  StringUtils::TrimRight<char,unsigned_int>("  ",2,local_f0 + 0x37);
  local_f0[7] = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 7,0x1a6);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>("   ",3,local_f0 + 0x37);
  local_f0[6] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 6,0x1aa);
  local_f0[0x37] = 3;
  StringUtils::TrimRight<char,unsigned_int>(" a ",3,local_f0 + 0x37);
  local_f0[5] = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 5,0x1ae);
  local_f0[0x37] = 5;
  StringUtils::TrimRight<char,unsigned_int>(" abc ",5,local_f0 + 0x37);
  local_f0[4] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 4,0x1b2);
  local_f0[0x37] = 4;
  StringUtils::TrimRight<char,unsigned_int>(" a  ",4,local_f0 + 0x37);
  local_f0[3] = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 3,0x1b6);
  local_f0[0x37] = 6;
  StringUtils::TrimRight<char,unsigned_int>(" abc  ",6,local_f0 + 0x37);
  local_f0[2] = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 2,0x1ba);
  local_f0[0x37] = 7;
  StringUtils::TrimRight<char,unsigned_int>("  a    ",6,local_f0 + 0x37);
  local_f0[1] = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0 + 1,0x1be);
  local_f0[0x37] = 8;
  StringUtils::TrimRight<char,unsigned_int>("  abc   ",4,local_f0 + 0x37);
  local_f0[0] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_f0 + 0x37,local_f0,0x1c2);
  return;
}

Assistant:

static void TestTrimRight(QTest &test) {
    SizeT32 end_offset = 0;

    StringUtils::TrimRight("", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("", 1U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("", 10U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a ", 1U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc ", 4U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a  ", 3U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc  ", 5U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("a   ", 4U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    StringUtils::TrimRight("abc   ", 6U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight("a ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("abc ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("a  ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("abc  ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("a   ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("a   ", 0U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 2U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("abc   ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 1U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight(" a", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" a", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" abc", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("  a", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("  abc", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("   a", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   a", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 0U, end_offset);
    test.IsEqual(end_offset, 0U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   abc", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight(" a ", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" abc ", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" a  ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" a\n\r\t", 0U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight(" abc  ", 0U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight("  a   ", 0U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 8;
    StringUtils::TrimRight("  abc   ", 0U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 1;
    StringUtils::TrimRight(" ", 1U, end_offset);
    test.IsEqual(end_offset, 1U, __LINE__);

    end_offset = 2;
    StringUtils::TrimRight("  ", 2U, end_offset);
    test.IsEqual(end_offset, 2U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight("   ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 3;
    StringUtils::TrimRight(" a ", 3U, end_offset);
    test.IsEqual(end_offset, 3U, __LINE__);

    end_offset = 5;
    StringUtils::TrimRight(" abc ", 5U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);

    end_offset = 4;
    StringUtils::TrimRight(" a  ", 4U, end_offset);
    test.IsEqual(end_offset, 4U, __LINE__);

    end_offset = 6;
    StringUtils::TrimRight(" abc  ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 7;
    StringUtils::TrimRight("  a    ", 6U, end_offset);
    test.IsEqual(end_offset, 6U, __LINE__);

    end_offset = 8;
    StringUtils::TrimRight("  abc   ", 4U, end_offset);
    test.IsEqual(end_offset, 5U, __LINE__);
}